

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O1

void __thiscall luna::CodeGenerateVisitor::LeaveLoop(CodeGenerateVisitor *this)

{
  size_t *psVar1;
  Function *this_00;
  GenerateFunction *pGVar2;
  GenerateBlock *pGVar3;
  _List_node_base *p_Var4;
  size_t sVar5;
  Instruction *pIVar6;
  short sVar7;
  _Self __tmp;
  _List_node_base *p_Var8;
  
  this_00 = this->current_function_->function_;
  sVar5 = Function::OpCodeSize(this_00);
  pGVar2 = this->current_function_;
  pGVar3 = pGVar2->current_block_;
  if ((pGVar3->current_loop_).loop_ast_ != (SyntaxTree *)0x0) {
    p_Var8 = (pGVar2->loop_jumps_).
             super__List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    while (p_Var8 != (_List_node_base *)&pGVar2->loop_jumps_) {
      if (p_Var8[1]._M_next == (_List_node_base *)(pGVar3->current_loop_).loop_ast_) {
        sVar7 = (short)sVar5;
        if (*(int *)&p_Var8[1]._M_prev == 1) {
LAB_00164cdc:
          sVar7 = sVar7 - (short)*(undefined4 *)((long)&p_Var8[1]._M_prev + 4);
        }
        else {
          sVar7 = 0;
          if (*(int *)&p_Var8[1]._M_prev == 0) {
            sVar7 = (short)(pGVar3->current_loop_).start_index_;
            goto LAB_00164cdc;
          }
        }
        pIVar6 = Function::GetMutableInstruction
                           (this_00,(long)*(int *)((long)&p_Var8[1]._M_prev + 4));
        *(short *)&pIVar6->opcode_ = sVar7;
        p_Var4 = p_Var8->_M_next;
        psVar1 = &(pGVar2->loop_jumps_).
                  super__List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var8);
        p_Var8 = p_Var4;
      }
      else {
        p_Var8 = p_Var8->_M_next;
      }
    }
  }
  return;
}

Assistant:

void LeaveLoop()
        {
            auto function = GetCurrentFunction();
            // Instruction index after loop
            int end_index = function->OpCodeSize();

            auto &loop = current_function_->current_block_->current_loop_;
            if (loop.loop_ast_)
            {
                auto &loop_jumps = current_function_->loop_jumps_;
                auto it = loop_jumps.begin();
                while (it != loop_jumps.end())
                {
                    if (it->loop_ast_ == loop.loop_ast_)
                    {
                        // Calculate diff between current index with index of destination
                        int diff = 0;
                        if (it->jump_type_ == LoopJumpInfo::JumpHead)
                            diff = loop.start_index_ - it->instruction_index_;
                        else if (it->jump_type_ == LoopJumpInfo::JumpTail)
                            diff = end_index - it->instruction_index_;

                        // Get instruction and refill its jump diff
                        auto i = function->GetMutableInstruction(it->instruction_index_);
                        i->RefillsBx(diff);

                        // Remove it from loop_jumps when it refilled
                        loop_jumps.erase(it++);
                    }
                    else
                        ++it;
                }
            }
        }